

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::localeDisplayName
          (LocaleDisplayNamesImpl *this,Locale *loc,UnicodeString *result)

{
  UBool UVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  char *__s_00;
  char *__s_01;
  UnicodeString *pUVar4;
  StringEnumeration *p;
  StringEnumeration *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar6;
  bool bVar7;
  undefined1 local_348 [8];
  UnicodeString temp3;
  UnicodeString local_2c8;
  int local_284;
  StringEnumeration *local_280;
  char *key;
  char value [100];
  undefined1 local_208 [8];
  UnicodeString temp2;
  LocalPointer<icu_63::StringEnumeration> e;
  undefined1 local_1b8 [4];
  UErrorCode status;
  UnicodeString temp;
  UnicodeString resultRemainder;
  char buffer [157];
  UBool hasVariant;
  UBool hasCountry;
  UBool hasScript;
  char *variant;
  char *country;
  char *script;
  char *local_70;
  char *lang;
  UnicodeString resultName;
  UnicodeString *result_local;
  Locale *loc_local;
  LocaleDisplayNamesImpl *this_local;
  
  resultName.fUnion._48_8_ = result;
  UVar1 = Locale::isBogus(loc);
  if (UVar1 != '\0') {
    UnicodeString::setToBogus((UnicodeString *)resultName.fUnion._48_8_);
    return (UnicodeString *)resultName.fUnion._48_8_;
  }
  UnicodeString::UnicodeString((UnicodeString *)&lang);
  local_70 = Locale::getLanguage(loc);
  sVar3 = strlen(local_70);
  if (sVar3 == 0) {
    local_70 = "root";
  }
  __s = Locale::getScript(loc);
  __s_00 = Locale::getCountry(loc);
  __s_01 = Locale::getVariant(loc);
  sVar3 = strlen(__s);
  bVar6 = sVar3 != 0;
  sVar3 = strlen(__s_00);
  bVar7 = sVar3 != 0;
  sVar3 = strlen(__s_01);
  if (this->dialectHandling == ULDN_DIALECT_NAMES) {
    if ((bVar6) && (bVar7)) {
      ncat((char *)(resultRemainder.fUnion.fStackFields.fBuffer + 0x17),0x9d,local_70,"_",__s,"_",
           __s_00,0);
      localeIdName(this,(char *)(resultRemainder.fUnion.fStackFields.fBuffer + 0x17),
                   (UnicodeString *)&lang);
      UVar1 = UnicodeString::isBogus((UnicodeString *)&lang);
      if (UVar1 == '\0') {
        bVar6 = false;
        bVar7 = false;
        goto LAB_0032d7e3;
      }
    }
    if (bVar6) {
      ncat((char *)(resultRemainder.fUnion.fStackFields.fBuffer + 0x17),0x9d,local_70,"_",__s,0);
      localeIdName(this,(char *)(resultRemainder.fUnion.fStackFields.fBuffer + 0x17),
                   (UnicodeString *)&lang);
      UVar1 = UnicodeString::isBogus((UnicodeString *)&lang);
      if (UVar1 == '\0') {
        bVar6 = false;
        goto LAB_0032d7e3;
      }
    }
    if (bVar7) {
      ncat((char *)(resultRemainder.fUnion.fStackFields.fBuffer + 0x17),0x9d,local_70,"_",__s_00,0);
      localeIdName(this,(char *)(resultRemainder.fUnion.fStackFields.fBuffer + 0x17),
                   (UnicodeString *)&lang);
      UVar1 = UnicodeString::isBogus((UnicodeString *)&lang);
      if (UVar1 == '\0') {
        bVar7 = false;
      }
    }
  }
LAB_0032d7e3:
  UVar1 = UnicodeString::isBogus((UnicodeString *)&lang);
  if ((UVar1 != '\0') || (UVar1 = UnicodeString::isEmpty((UnicodeString *)&lang), UVar1 != '\0')) {
    localeIdName(this,local_70,(UnicodeString *)&lang);
  }
  UnicodeString::UnicodeString((UnicodeString *)((long)&temp.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_1b8);
  e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_ = U_ZERO_ERROR;
  if (bVar6) {
    pUVar4 = scriptDisplayName(this,__s,(UnicodeString *)local_1b8,'\x01');
    UnicodeString::append((UnicodeString *)((long)&temp.fUnion + 0x30),pUVar4);
  }
  if (bVar7) {
    pUVar4 = regionDisplayName(this,__s_00,(UnicodeString *)local_1b8,'\x01');
    appendWithSep(this,(UnicodeString *)((long)&temp.fUnion + 0x30),pUVar4);
  }
  if (sVar3 != 0) {
    pUVar4 = variantDisplayName(this,__s_01,(UnicodeString *)local_1b8,'\x01');
    appendWithSep(this,(UnicodeString *)((long)&temp.fUnion + 0x30),pUVar4);
  }
  UnicodeString::findAndReplace
            ((UnicodeString *)((long)&temp.fUnion + 0x30),&this->formatOpenParen,
             &this->formatReplaceOpenParen);
  UnicodeString::findAndReplace
            ((UnicodeString *)((long)&temp.fUnion + 0x30),&this->formatCloseParen,
             &this->formatReplaceCloseParen);
  p = Locale::createKeywords
                (loc,(UErrorCode *)
                     ((long)&e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4));
  LocalPointer<icu_63::StringEnumeration>::LocalPointer
            ((LocalPointer<icu_63::StringEnumeration> *)((long)&temp2.fUnion + 0x30),p);
  UVar1 = LocalPointerBase<icu_63::StringEnumeration>::isValid
                    ((LocalPointerBase<icu_63::StringEnumeration> *)((long)&temp2.fUnion + 0x30));
  if ((UVar1 != '\0') &&
     (UVar1 = ::U_SUCCESS(e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_),
     UVar1 != '\0')) {
    UnicodeString::UnicodeString((UnicodeString *)local_208);
    while( true ) {
      pSVar5 = LocalPointerBase<icu_63::StringEnumeration>::operator->
                         ((LocalPointerBase<icu_63::StringEnumeration> *)
                          ((long)&temp2.fUnion + 0x30));
      p = (StringEnumeration *)0x0;
      iVar2 = (*(pSVar5->super_UObject)._vptr_UObject[5])
                        (pSVar5,0,(undefined1 *)
                                  ((long)&e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr +
                                  4));
      pSVar5 = (StringEnumeration *)CONCAT44(extraout_var,iVar2);
      local_280 = pSVar5;
      if (pSVar5 == (StringEnumeration *)0x0) break;
      key._0_1_ = 0;
      Locale::getKeywordValue
                (loc,(char *)pSVar5,(char *)&key,100,
                 (UErrorCode *)((long)&e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4))
      ;
      UVar1 = ::U_FAILURE(e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_);
      if ((UVar1 != '\0') ||
         (e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr._4_4_ ==
          U_STRING_NOT_TERMINATED_WARNING)) {
        this_local = (LocaleDisplayNamesImpl *)resultName.fUnion._48_8_;
        local_284 = 1;
        p = pSVar5;
        goto LAB_0032ddce;
      }
      keyDisplayName(this,(char *)local_280,(UnicodeString *)local_1b8,'\x01');
      UnicodeString::findAndReplace
                ((UnicodeString *)local_1b8,&this->formatOpenParen,&this->formatReplaceOpenParen);
      UnicodeString::findAndReplace
                ((UnicodeString *)local_1b8,&this->formatCloseParen,&this->formatReplaceCloseParen);
      keyValueDisplayName(this,(char *)local_280,(char *)&key,(UnicodeString *)local_208,'\x01');
      UnicodeString::findAndReplace
                ((UnicodeString *)local_208,&this->formatOpenParen,&this->formatReplaceOpenParen);
      UnicodeString::findAndReplace
                ((UnicodeString *)local_208,&this->formatCloseParen,&this->formatReplaceCloseParen);
      UnicodeString::UnicodeString(&local_2c8,(char *)&key,-1,kInvariant);
      UVar1 = UnicodeString::operator!=((UnicodeString *)local_208,&local_2c8);
      UnicodeString::~UnicodeString(&local_2c8);
      if (UVar1 == '\0') {
        UnicodeString::UnicodeString
                  ((UnicodeString *)((long)&temp3.fUnion + 0x30),(char *)local_280,-1,kInvariant);
        UVar1 = UnicodeString::operator!=
                          ((UnicodeString *)local_1b8,(UnicodeString *)((long)&temp3.fUnion + 0x30))
        ;
        UnicodeString::~UnicodeString((UnicodeString *)((long)&temp3.fUnion + 0x30));
        if (UVar1 == '\0') {
          pUVar4 = appendWithSep(this,(UnicodeString *)((long)&temp.fUnion + 0x30),
                                 (UnicodeString *)local_1b8);
          pUVar4 = UnicodeString::append(pUVar4,L'=');
          UnicodeString::append(pUVar4,(UnicodeString *)local_208);
        }
        else {
          UnicodeString::UnicodeString((UnicodeString *)local_348);
          SimpleFormatter::format
                    (&this->keyTypeFormat,(UnicodeString *)local_1b8,(UnicodeString *)local_208,
                     (UnicodeString *)local_348,
                     (UErrorCode *)
                     ((long)&e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4));
          appendWithSep(this,(UnicodeString *)((long)&temp.fUnion + 0x30),(UnicodeString *)local_348
                       );
          UnicodeString::~UnicodeString((UnicodeString *)local_348);
        }
      }
      else {
        appendWithSep(this,(UnicodeString *)((long)&temp.fUnion + 0x30),(UnicodeString *)local_208);
      }
    }
    local_284 = 0;
LAB_0032ddce:
    UnicodeString::~UnicodeString((UnicodeString *)local_208);
    if (local_284 != 0) goto LAB_0032ded9;
  }
  UVar1 = UnicodeString::isEmpty((UnicodeString *)((long)&temp.fUnion + 0x30));
  if (UVar1 == '\0') {
    iVar2 = UnicodeString::remove((UnicodeString *)resultName.fUnion._48_8_,(char *)p);
    SimpleFormatter::format
              (&this->format,(UnicodeString *)&lang,(UnicodeString *)((long)&temp.fUnion + 0x30),
               (UnicodeString *)CONCAT44(extraout_var_00,iVar2),
               (UErrorCode *)((long)&e.super_LocalPointerBase<icu_63::StringEnumeration>.ptr + 4));
    this_local = (LocaleDisplayNamesImpl *)
                 adjustForUsageAndContext
                           (this,kCapContextUsageLanguage,(UnicodeString *)resultName.fUnion._48_8_)
    ;
    local_284 = 1;
  }
  else {
    UnicodeString::operator=((UnicodeString *)resultName.fUnion._48_8_,(UnicodeString *)&lang);
    this_local = (LocaleDisplayNamesImpl *)
                 adjustForUsageAndContext
                           (this,kCapContextUsageLanguage,(UnicodeString *)resultName.fUnion._48_8_)
    ;
    local_284 = 1;
  }
LAB_0032ded9:
  LocalPointer<icu_63::StringEnumeration>::~LocalPointer
            ((LocalPointer<icu_63::StringEnumeration> *)((long)&temp2.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)local_1b8);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&temp.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)&lang);
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::localeDisplayName(const Locale& loc,
                                          UnicodeString& result) const {
  if (loc.isBogus()) {
    result.setToBogus();
    return result;
  }
  UnicodeString resultName;

  const char* lang = loc.getLanguage();
  if (uprv_strlen(lang) == 0) {
    lang = "root";
  }
  const char* script = loc.getScript();
  const char* country = loc.getCountry();
  const char* variant = loc.getVariant();

  UBool hasScript = uprv_strlen(script) > 0;
  UBool hasCountry = uprv_strlen(country) > 0;
  UBool hasVariant = uprv_strlen(variant) > 0;

  if (dialectHandling == ULDN_DIALECT_NAMES) {
    char buffer[ULOC_FULLNAME_CAPACITY];
    do { // loop construct is so we can break early out of search
      if (hasScript && hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, "_", country, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          hasCountry = FALSE;
          break;
        }
      }
      if (hasScript) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          break;
        }
      }
      if (hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", country, (char*)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasCountry = FALSE;
          break;
        }
      }
    } while (FALSE);
  }
  if (resultName.isBogus() || resultName.isEmpty()) {
    localeIdName(lang, resultName);
  }

  UnicodeString resultRemainder;
  UnicodeString temp;
  UErrorCode status = U_ZERO_ERROR;

  if (hasScript) {
    resultRemainder.append(scriptDisplayName(script, temp, TRUE));
  }
  if (hasCountry) {
    appendWithSep(resultRemainder, regionDisplayName(country, temp, TRUE));
  }
  if (hasVariant) {
    appendWithSep(resultRemainder, variantDisplayName(variant, temp, TRUE));
  }
  resultRemainder.findAndReplace(formatOpenParen, formatReplaceOpenParen);
  resultRemainder.findAndReplace(formatCloseParen, formatReplaceCloseParen);

  LocalPointer<StringEnumeration> e(loc.createKeywords(status));
  if (e.isValid() && U_SUCCESS(status)) {
    UnicodeString temp2;
    char value[ULOC_KEYWORD_AND_VALUES_CAPACITY]; // sigh, no ULOC_VALUE_CAPACITY
    const char* key;
    while ((key = e->next((int32_t *)0, status)) != NULL) {
      value[0] = 0;
      loc.getKeywordValue(key, value, ULOC_KEYWORD_AND_VALUES_CAPACITY, status);
      if (U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING) {
        return result;
      }
      keyDisplayName(key, temp, TRUE);
      temp.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      keyValueDisplayName(key, value, temp2, TRUE);
      temp2.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp2.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      if (temp2 != UnicodeString(value, -1, US_INV)) {
        appendWithSep(resultRemainder, temp2);
      } else if (temp != UnicodeString(key, -1, US_INV)) {
        UnicodeString temp3;
        keyTypeFormat.format(temp, temp2, temp3, status);
        appendWithSep(resultRemainder, temp3);
      } else {
        appendWithSep(resultRemainder, temp)
          .append((UChar)0x3d /* = */)
          .append(temp2);
      }
    }
  }

  if (!resultRemainder.isEmpty()) {
    format.format(resultName, resultRemainder, result.remove(), status);
    return adjustForUsageAndContext(kCapContextUsageLanguage, result);
  }

  result = resultName;
  return adjustForUsageAndContext(kCapContextUsageLanguage, result);
}